

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

bool Am_Connection::Register_Type
               (Am_Value_Type type,Am_Marshall_Method *marshall,Am_Unmarshall_Method *unmarshall,
               unsigned_long id)

{
  bool bVar1;
  mapped_type_conflict *pmVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  mapped_type_conflict mVar5;
  Am_Value local_68;
  _Base_ptr local_58;
  _Base_ptr p_Stack_50;
  key_type local_40;
  
  if (id == 0) {
    id_count = id_count + 1;
    bVar1 = true;
    id = id_count;
  }
  else {
    OpenAmulet::Map<unsigned_short,_Am_Value,_std::less<unsigned_short>_>::GetAt
              ((Map<unsigned_short,_Am_Value,_std::less<unsigned_short>_> *)&local_68,
               (unsigned_short *)&Net_IDs);
    bVar1 = Am_Value::operator!=(&local_68,0);
    Am_Value::~Am_Value(&local_68);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Declared duplicate type! Overwriting...",0x27);
    }
    bVar1 = !bVar1;
    if (id_count <= id) {
      id_count = id;
    }
  }
  local_40.type = 2;
  local_40.value.long_value._2_6_ = 0;
  local_40.value.long_value._0_2_ = type;
  pmVar2 = std::
           map<Am_Value,_unsigned_short,_std::less<Am_Value>,_std::allocator<std::pair<const_Am_Value,_unsigned_short>_>_>
           ::operator[](&Types.mMap,&local_40);
  mVar5 = (mapped_type_conflict)id;
  *pmVar2 = mVar5;
  Am_Value::~Am_Value(&local_40);
  local_58 = (_Base_ptr)marshall->from_wrapper;
  p_Stack_50 = (_Base_ptr)marshall->Call;
  local_68.type = mVar5;
  pmVar3 = std::
           map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Marshall_Method>_>_>
           ::operator[](&Marshall_Methods.mMap,&local_68.type);
  pmVar3->from_wrapper = (Am_Method_Wrapper *)local_58;
  pmVar3->Call = (Am_Marshall_Method_Type *)p_Stack_50;
  local_58 = (_Base_ptr)unmarshall->from_wrapper;
  p_Stack_50 = (_Base_ptr)unmarshall->Call;
  local_68.type = mVar5;
  pmVar4 = std::
           map<unsigned_short,_Am_Unmarshall_Method,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Unmarshall_Method>_>_>
           ::operator[](&Unmarshall_Methods.mMap,&local_68.type);
  pmVar4->from_wrapper = (Am_Method_Wrapper *)local_58;
  pmVar4->Call = (Am_Unmarshall_Method_Type *)p_Stack_50;
  return bVar1;
}

Assistant:

bool
Am_Connection::Register_Type(Am_Value_Type type,
                             const Am_Marshall_Method &marshall,
                             const Am_Unmarshall_Method &unmarshall,
                             unsigned long id)
{
  bool was_empty = true;

  // Am_Network will generate an ID
  if (id == 0) {
    id = ++id_count;
  } else // The user provided an ID
  {
    // The id provided is already registered!
    if (Net_IDs.GetAt(id) != (0L)) {
      std::cerr << "Declared duplicate type! Overwriting...";
      was_empty = false;
    }

    id_count = (id > id_count ? id : id_count);
  }

  Types.SetAt(type, id);
  Marshall_Methods.SetAt(id, marshall);
  Unmarshall_Methods.SetAt(id, unmarshall);

  return (was_empty);
}